

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O1

void duckdb::StandardErrorOfTheMeanOperation::Finalize<double,duckdb::StddevState>
               (StddevState *state,double *target,AggregateFinalizeData *finalize_data)

{
  uint64_t uVar1;
  bool bVar2;
  OutOfRangeException *this;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  string local_40;
  
  uVar1 = state->count;
  if (uVar1 == 0) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  auVar5._8_4_ = (int)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  dVar3 = state->dsquared /
          ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  auVar6._0_8_ = (double)CONCAT44(0x43300000,(int)state->count);
  auVar6._8_4_ = (int)(state->count >> 0x20);
  auVar6._12_4_ = 0x45300000;
  dVar4 = (auVar6._8_8_ - 1.9342813113834067e+25) + (auVar6._0_8_ - 4503599627370496.0);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  *target = dVar3 / dVar4;
  bVar2 = Value::DoubleIsFinite(dVar3 / dVar4);
  if (bVar2) {
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SEM is out of range!","");
  OutOfRangeException::OutOfRangeException(this,&local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			target = sqrt(state.dsquared / state.count) / sqrt((state.count));
			if (!Value::DoubleIsFinite(target)) {
				throw OutOfRangeException("SEM is out of range!");
			}
		}
	}